

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

void gnuplotio::
     deref_and_print<gnuplotio::IteratorRange<int_const*,int>,gnuplotio::IteratorRange<int_const*,int>,gnuplotio::ModeBinary>
               (undefined8 stream,long arg)

{
  PairOfRange<gnuplotio::IteratorRange<const_int_*,_int>,_gnuplotio::IteratorRange<const_int_*,_int>_>
  *arg_local;
  ostream *stream_local;
  
  deref_and_print<gnuplotio::IteratorRange<int_const*,int>,gnuplotio::ModeBinary>(stream,arg);
  deref_and_print<gnuplotio::IteratorRange<int_const*,int>,gnuplotio::ModeBinary>(stream,arg + 0x10)
  ;
  return;
}

Assistant:

void deref_and_print(std::ostream &stream, const PairOfRange<T, U> &arg, PrintMode) {
    deref_and_print(stream, arg.l, PrintMode());
    if(PrintMode::is_text) stream << " ";
    deref_and_print(stream, arg.r, PrintMode());
}